

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O2

EvalBResults parser::Evaluate(string *ref_fname,string *hyp_fname)

{
  ostream *poVar1;
  FILE *__stream;
  istream *piVar2;
  float in_XMM1_Da;
  EvalBResults EVar3;
  string line;
  string cmd;
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  fpstream;
  istream in;
  undefined8 local_208;
  undefined8 local_200;
  undefined1 local_1f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  local_1c8;
  istream local_140;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 "echo ",ref_fname);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8," "
                );
  std::operator+(&local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140,
                 hyp_fname);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_1c8);
  poVar1 = std::operator<<((ostream *)&std::cerr,"COMMAND: ");
  poVar1 = std::operator<<(poVar1,(string *)&local_1e8);
  std::endl<char,std::char_traits<char>>(poVar1);
  __stream = popen(local_1e8._M_dataplus._M_p,"r");
  local_140._vptr_basic_istream._0_4_ = fileno(__stream);
  local_208 = (undefined1 *)((ulong)local_208._4_4_ << 0x20);
  boost::iostreams::
  stream_buffer<boost::iostreams::file_descriptor_source,std::char_traits<char>,std::allocator<char>,boost::iostreams::input_seekable>
  ::stream_buffer<int,boost::iostreams::file_descriptor_flags>
            ((stream_buffer<boost::iostreams::file_descriptor_source,std::char_traits<char>,std::allocator<char>,boost::iostreams::input_seekable>
              *)&local_1c8,(int *)&local_140,(file_descriptor_flags *)&local_208,(type *)0x0);
  std::istream::istream(&local_140,(streambuf *)&local_1c8);
  local_208 = local_1f8;
  local_200 = 0;
  local_1f8[0] = 0;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (&local_140,(string *)&local_208);
    if (((&piVar2->field_0x20)[(long)piVar2->_vptr_basic_istream[-3]] & 5) != 0) break;
    poVar1 = std::operator<<((ostream *)&std::cerr,"Got line: ");
    poVar1 = std::operator<<(poVar1,(string *)&local_208);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  fclose(__stream);
  std::__cxx11::string::~string((string *)&local_208);
  std::istream::~istream(&local_140);
  boost::iostreams::
  stream_buffer<boost::iostreams::file_descriptor_source,_std::char_traits<char>,_std::allocator<char>,_boost::iostreams::input_seekable>
  ::~stream_buffer(&local_1c8);
  EVar3._0_8_ = std::__cxx11::string::~string((string *)&local_1e8);
  EVar3.f = in_XMM1_Da;
  return EVar3;
}

Assistant:

EvalBResults Evaluate(const string& ref_fname, const string& hyp_fname) {
  string cmd = "echo " + ref_fname + " " + hyp_fname;
  cerr << "COMMAND: " << cmd << endl;
  FILE *pipe = popen(cmd.c_str(), "r");
  io::stream_buffer<io::file_descriptor_source> fpstream (fileno(pipe), io::never_close_handle);
  istream in(&fpstream);
  string line;
  while(getline(in, line)) {
    cerr << "Got line: " << line << endl;
  }
  fclose(pipe);
  EvalBResults r;
  return r;
}